

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep.c
# Opt level: O1

int mriStep_RKCoeffs(MRIStepCoupling MRIC,int is,int *stage_map,realtype *Ae_row,realtype *Ai_row)

{
  ulong uVar1;
  uint uVar2;
  realtype ***ppprVar3;
  realtype ***ppprVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  double dVar10;
  
  iVar5 = -0x29;
  if ((((0 < is) && (Ai_row != (realtype *)0x0)) && (Ae_row != (realtype *)0x0)) &&
     (stage_map != (int *)0x0)) {
    uVar2 = MRIC->stages;
    if (is < (int)uVar2) {
      if (0 < (int)uVar2) {
        uVar7 = 0;
        do {
          Ae_row[uVar7] = 0.0;
          Ai_row[uVar7] = 0.0;
          uVar7 = uVar7 + 1;
        } while (uVar2 != uVar7);
      }
      iVar5 = MRIC->nmat;
      if ((long)iVar5 < 1) {
        return 0;
      }
      ppprVar3 = MRIC->W;
      ppprVar4 = MRIC->G;
      uVar7 = 1;
      if (1 < is) {
        uVar7 = (ulong)(uint)is;
      }
      uVar6 = 0;
      do {
        uVar1 = uVar6 + 1;
        dVar10 = 1.0 / (double)(uVar1 & 0xffffffff);
        if (ppprVar3 != (realtype ***)0x0) {
          uVar9 = 0;
          do {
            lVar8 = (long)stage_map[uVar9];
            if (-1 < lVar8) {
              Ae_row[lVar8] = ppprVar3[uVar6][(uint)is][uVar9] * dVar10 + Ae_row[lVar8];
            }
            uVar9 = uVar9 + 1;
          } while (uVar7 != uVar9);
        }
        if (ppprVar4 != (realtype ***)0x0) {
          uVar9 = 0;
          do {
            lVar8 = (long)stage_map[uVar9];
            if (-1 < lVar8) {
              Ai_row[lVar8] = ppprVar4[uVar6][(uint)is][uVar9] * dVar10 + Ai_row[lVar8];
            }
            uVar9 = uVar9 + 1;
          } while (is + 1 != uVar9);
        }
        uVar6 = uVar1;
      } while (uVar1 != (long)iVar5);
      iVar5 = 0;
    }
  }
  return iVar5;
}

Assistant:

int mriStep_RKCoeffs(MRIStepCoupling MRIC, int is, int *stage_map,
                     realtype *Ae_row, realtype *Ai_row)
{
  int j, k;
  realtype kconst;

  if (is < 1 || is >= MRIC->stages || !stage_map || !Ae_row || !Ai_row)
    return ARK_INVALID_TABLE;

  /* initialize RK coefficient array */
  for (j = 0; j < MRIC->stages; j++) {
    Ae_row[j] = ZERO;
    Ai_row[j] = ZERO;
  }

  /* compute RK coefficients */
  for (k = 0; k < MRIC->nmat; k++) {
    kconst = ONE/(k+ONE);
    if (MRIC->W) {
      for (j = 0; j < is; j++)
        if (stage_map[j] > -1)
          Ae_row[stage_map[j]] += (MRIC->W[k][is][j] * kconst);
    }
    if (MRIC->G) {
      for (j = 0; j <= is; j++)
        if (stage_map[j] > -1)
          Ai_row[stage_map[j]] += (MRIC->G[k][is][j] * kconst);
    }
  }

  return(ARK_SUCCESS);
}